

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::
       fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,CappedArray<char,_14UL> *first,ArrayPtr<const_char> *rest,
                 StringPtr *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
                 ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
                 ArrayPtr<const_char> *rest_6)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = first->currentSize;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    target[sVar3] = first->content[sVar3];
  }
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (target + sVar3,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}